

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O1

void get_msurf_descriptor_haar_unroll_2_6_True(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  float *data;
  ulong uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  int k_count;
  int iVar34;
  ulong uVar35;
  int iVar36;
  int iVar37;
  uint uVar38;
  int iVar39;
  float *pfVar40;
  long lVar41;
  float *pfVar42;
  long lVar43;
  long lVar44;
  int iVar45;
  long lVar46;
  int iVar47;
  long lVar48;
  int iVar49;
  float *pfVar50;
  byte bVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar71;
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar84;
  undefined1 auVar86 [12];
  undefined1 auVar85 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [64];
  int data_width;
  float local_f8;
  
  auVar59._8_4_ = 0x80000000;
  auVar59._0_8_ = 0x8000000080000000;
  auVar59._12_4_ = 0x80000000;
  auVar60._8_4_ = 0x3effffff;
  auVar60._0_8_ = 0x3effffff3effffff;
  auVar60._12_4_ = 0x3effffff;
  auVar85 = ZEXT1664(auVar60);
  fVar66 = ipoint->scale;
  auVar89 = ZEXT464((uint)fVar66);
  auVar52 = vpternlogd_avx512vl(auVar60,ZEXT416((uint)fVar66),auVar59,0xf8);
  auVar52 = ZEXT416((uint)(fVar66 + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  iVar18 = (int)auVar52._0_4_;
  fVar64 = -0.08 / (fVar66 * fVar66);
  auVar53 = vpternlogd_avx512vl(auVar60,ZEXT416((uint)ipoint->x),auVar59,0xf8);
  auVar53 = ZEXT416((uint)(ipoint->x + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54._0_8_ = (double)auVar53._0_4_;
  auVar54._8_8_ = auVar53._8_8_;
  auVar58._0_8_ = (double)fVar66;
  auVar58._8_8_ = 0;
  auVar53 = vfmadd231sd_fma(auVar54,auVar58,ZEXT816(0x3fe0000000000000));
  auVar57._0_4_ = (float)auVar53._0_8_;
  auVar57._4_12_ = auVar53._4_12_;
  auVar53 = vpternlogd_avx512vl(auVar60,ZEXT416((uint)ipoint->y),auVar59,0xf8);
  auVar53 = ZEXT416((uint)(ipoint->y + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar55._0_8_ = (double)auVar53._0_4_;
  auVar55._8_8_ = auVar53._8_8_;
  auVar53 = vfmadd231sd_fma(auVar55,auVar58,ZEXT816(0x3fe0000000000000));
  auVar56._0_4_ = (float)auVar53._0_8_;
  auVar56._4_12_ = auVar53._4_12_;
  auVar53._0_4_ = (int)auVar52._0_4_;
  auVar53._4_4_ = (int)auVar52._4_4_;
  auVar53._8_4_ = (int)auVar52._8_4_;
  auVar53._12_4_ = (int)auVar52._12_4_;
  auVar52 = vcvtdq2ps_avx(auVar53);
  fVar3 = auVar57._0_4_ - auVar52._0_4_;
  fVar4 = auVar56._0_4_ - auVar52._0_4_;
  auVar52 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar66),auVar57);
  auVar53 = vpternlogd_avx512vl(auVar60,auVar52,auVar59,0xf8);
  auVar52 = ZEXT416((uint)(auVar52._0_4_ + auVar53._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53 = ZEXT416((uint)fVar66);
  if (iVar18 < (int)auVar52._0_4_) {
    auVar52 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar53,auVar56);
    auVar61._8_4_ = 0x3effffff;
    auVar61._0_8_ = 0x3effffff3effffff;
    auVar61._12_4_ = 0x3effffff;
    auVar62._8_4_ = 0x80000000;
    auVar62._0_8_ = 0x8000000080000000;
    auVar62._12_4_ = 0x80000000;
    auVar54 = vpternlogd_avx512vl(auVar62,auVar52,auVar61,0xea);
    auVar52 = ZEXT416((uint)(auVar52._0_4_ + auVar54._0_4_));
    auVar52 = vroundss_avx(auVar52,auVar52,0xb);
    if (iVar18 < (int)auVar52._0_4_) {
      auVar52 = vfmadd231ss_fma(auVar57,auVar53,ZEXT416(0x41300000));
      auVar63._8_4_ = 0x80000000;
      auVar63._0_8_ = 0x8000000080000000;
      auVar63._12_4_ = 0x80000000;
      auVar54 = vpternlogd_avx512vl(auVar63,auVar52,auVar61,0xea);
      auVar52 = ZEXT416((uint)(auVar52._0_4_ + auVar54._0_4_));
      auVar52 = vroundss_avx(auVar52,auVar52,0xb);
      if ((int)auVar52._0_4_ + iVar18 <= iimage->width) {
        auVar52 = vfmadd231ss_fma(auVar56,auVar53,ZEXT416(0x41300000));
        auVar14._8_4_ = 0x80000000;
        auVar14._0_8_ = 0x8000000080000000;
        auVar14._12_4_ = 0x80000000;
        auVar54 = vpternlogd_avx512vl(auVar61,auVar52,auVar14,0xf8);
        auVar52 = ZEXT416((uint)(auVar52._0_4_ + auVar54._0_4_));
        auVar52 = vroundss_avx(auVar52,auVar52,0xb);
        if ((int)auVar52._0_4_ + iVar18 <= iimage->height) {
          fVar3 = fVar3 + 0.5;
          pfVar42 = iimage->data;
          iVar1 = iimage->data_width;
          iVar49 = iVar18 * 2;
          pfVar40 = haarResponseY + 0x1d;
          pfVar50 = haarResponseX + 0x1d;
          uVar21 = 0xfffffff4;
          do {
            auVar52._0_4_ = (float)(int)uVar21;
            auVar52._4_12_ = in_ZMM8._4_12_;
            auVar52 = vfmadd213ss_fma(auVar52,auVar53,ZEXT416((uint)(fVar4 + 0.5)));
            iVar19 = (int)auVar52._0_4_;
            auVar76._0_4_ = (float)(int)(uVar21 | 1);
            auVar76._4_12_ = in_ZMM8._4_12_;
            auVar52 = vfmadd213ss_fma(auVar76,auVar53,ZEXT416((uint)(fVar4 + 0.5)));
            iVar28 = (int)auVar52._0_4_;
            iVar24 = (iVar19 + -1) * iVar1;
            iVar25 = (iVar19 + -1 + iVar18) * iVar1;
            iVar27 = (iVar19 + -1 + iVar49) * iVar1;
            iVar45 = (iVar28 + -1) * iVar1;
            iVar26 = (iVar28 + -1 + iVar18) * iVar1;
            iVar19 = (iVar28 + -1 + iVar49) * iVar1;
            lVar32 = 0;
            do {
              iVar28 = (int)lVar32;
              auVar77._0_4_ = (float)(iVar28 + -0xc);
              auVar77._4_12_ = in_ZMM8._4_12_;
              auVar52 = vfmadd213ss_fma(auVar77,auVar53,ZEXT416((uint)fVar3));
              iVar39 = (int)auVar52._0_4_;
              auVar78._0_4_ = (float)(iVar28 + -0xb);
              auVar86 = auVar85._4_12_;
              auVar78._4_12_ = auVar86;
              auVar52 = vfmadd213ss_fma(auVar78,auVar53,ZEXT416((uint)fVar3));
              iVar29 = (int)auVar52._0_4_;
              auVar79._0_4_ = (float)(iVar28 + -10);
              auVar79._4_12_ = auVar86;
              auVar55 = ZEXT416((uint)fVar3);
              auVar52 = vfmadd213ss_fma(auVar79,auVar53,auVar55);
              iVar47 = (int)auVar52._0_4_;
              auVar83._0_4_ = (float)(iVar28 + -9);
              auVar83._4_12_ = auVar86;
              auVar52 = vfmadd213ss_fma(auVar83,auVar53,auVar55);
              auVar82._0_4_ = (float)(iVar28 + -8);
              auVar82._4_12_ = auVar86;
              auVar80._0_4_ = (float)(iVar28 + -7);
              auVar80._4_12_ = auVar86;
              iVar36 = iVar39 + -1 + iVar18;
              iVar34 = iVar39 + -1 + iVar49;
              fVar66 = pfVar42[iVar25 + -1 + iVar39];
              fVar65 = pfVar42[iVar27 + -1 + iVar39];
              fVar71 = pfVar42[iVar27 + iVar34];
              fVar5 = pfVar42[iVar24 + -1 + iVar39];
              fVar6 = pfVar42[iVar24 + iVar34];
              auVar56 = SUB6416(ZEXT464(0x40000000),0);
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar24 + iVar36] -
                                                      pfVar42[iVar27 + iVar36])),auVar56,
                                        ZEXT416((uint)(fVar71 - fVar5)));
              fVar72 = pfVar42[iVar25 + iVar34];
              pfVar50[lVar32 + -0x1d] = (fVar65 - fVar6) + auVar54._0_4_;
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(fVar66 - fVar72)),auVar56,
                                        ZEXT416((uint)(fVar71 - fVar5)));
              pfVar40[lVar32 + -0x1d] = auVar54._0_4_ - (fVar65 - fVar6);
              fVar66 = pfVar42[iVar26 + -1 + iVar39];
              fVar65 = pfVar42[iVar19 + -1 + iVar39];
              fVar71 = pfVar42[iVar34 + iVar19];
              iVar20 = (int)auVar52._0_4_;
              fVar5 = pfVar42[iVar45 + -1 + iVar39];
              fVar6 = pfVar42[iVar45 + iVar34];
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar45 + iVar36] -
                                                      pfVar42[iVar36 + iVar19])),auVar56,
                                        ZEXT416((uint)(fVar71 - fVar5)));
              fVar72 = pfVar42[iVar26 + iVar34];
              pfVar50[lVar32 + -5] = (fVar65 - fVar6) + auVar52._0_4_;
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar66 - fVar72)),auVar56,
                                        ZEXT416((uint)(fVar71 - fVar5)));
              pfVar40[lVar32 + -5] = auVar52._0_4_ - (fVar65 - fVar6);
              iVar34 = iVar29 + -1 + iVar18;
              iVar39 = iVar29 + -1 + iVar49;
              fVar66 = pfVar42[iVar25 + -1 + iVar29];
              fVar65 = pfVar42[iVar27 + -1 + iVar29];
              fVar71 = pfVar42[iVar27 + iVar39];
              fVar5 = pfVar42[iVar24 + -1 + iVar29];
              fVar6 = pfVar42[iVar24 + iVar39];
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar24 + iVar34] -
                                                      pfVar42[iVar27 + iVar34])),auVar56,
                                        ZEXT416((uint)(fVar71 - fVar5)));
              fVar72 = pfVar42[iVar25 + iVar39];
              pfVar50[lVar32 + -0x1c] = (fVar65 - fVar6) + auVar52._0_4_;
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar66 - fVar72)),auVar56,
                                        ZEXT416((uint)(fVar71 - fVar5)));
              pfVar40[lVar32 + -0x1c] = auVar52._0_4_ - (fVar65 - fVar6);
              fVar66 = pfVar42[iVar26 + -1 + iVar29];
              fVar65 = pfVar42[iVar19 + -1 + iVar29];
              fVar71 = pfVar42[iVar39 + iVar19];
              auVar52 = vfmadd213ss_fma(auVar82,auVar53,auVar55);
              fVar5 = pfVar42[iVar45 + -1 + iVar29];
              fVar6 = pfVar42[iVar45 + iVar39];
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar45 + iVar34] -
                                                      pfVar42[iVar34 + iVar19])),auVar56,
                                        ZEXT416((uint)(fVar71 - fVar5)));
              fVar72 = pfVar42[iVar26 + iVar39];
              pfVar50[lVar32 + -4] = (fVar65 - fVar6) + auVar54._0_4_;
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(fVar66 - fVar72)),auVar56,
                                        ZEXT416((uint)(fVar71 - fVar5)));
              iVar39 = iVar47 + -1 + iVar18;
              iVar29 = iVar47 + -1 + iVar49;
              pfVar40[lVar32 + -4] = auVar54._0_4_ - (fVar65 - fVar6);
              fVar66 = pfVar42[iVar25 + -1 + iVar47];
              fVar65 = pfVar42[iVar27 + -1 + iVar47];
              fVar71 = pfVar42[iVar27 + iVar29];
              fVar5 = pfVar42[iVar24 + -1 + iVar47];
              fVar6 = pfVar42[iVar24 + iVar29];
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar24 + iVar39] -
                                                      pfVar42[iVar27 + iVar39])),auVar56,
                                        ZEXT416((uint)(fVar71 - fVar5)));
              fVar72 = pfVar42[iVar25 + iVar29];
              pfVar50[lVar32 + -0x1b] = (fVar65 - fVar6) + auVar54._0_4_;
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(fVar66 - fVar72)),auVar56,
                                        ZEXT416((uint)(fVar71 - fVar5)));
              pfVar40[lVar32 + -0x1b] = auVar54._0_4_ - (fVar65 - fVar6);
              fVar66 = pfVar42[iVar26 + -1 + iVar47];
              fVar65 = pfVar42[iVar19 + -1 + iVar47];
              in_ZMM8 = ZEXT464((uint)pfVar42[iVar29 + iVar19]);
              iVar34 = (int)auVar52._0_4_;
              auVar52 = vfmadd213ss_fma(auVar80,auVar53,auVar55);
              fVar71 = pfVar42[iVar45 + iVar29];
              auVar55 = ZEXT416((uint)(pfVar42[iVar29 + iVar19] - pfVar42[iVar45 + -1 + iVar47]));
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar45 + iVar39] -
                                                      pfVar42[iVar39 + iVar19])),auVar56,auVar55);
              fVar5 = pfVar42[iVar26 + iVar29];
              pfVar50[lVar32 + -3] = (fVar65 - fVar71) + auVar54._0_4_;
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(fVar66 - fVar5)),auVar56,auVar55);
              pfVar40[lVar32 + -3] = auVar54._0_4_ - (fVar65 - fVar71);
              iVar47 = iVar20 + -1 + iVar18;
              iVar39 = iVar20 + -1 + iVar49;
              fVar66 = pfVar42[iVar25 + -1 + iVar20];
              fVar65 = pfVar42[iVar27 + -1 + iVar20];
              fVar71 = pfVar42[iVar27 + iVar39];
              fVar5 = pfVar42[iVar24 + -1 + iVar20];
              fVar6 = pfVar42[iVar24 + iVar39];
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar24 + iVar47] -
                                                      pfVar42[iVar27 + iVar47])),auVar56,
                                        ZEXT416((uint)(fVar71 - fVar5)));
              fVar72 = pfVar42[iVar25 + iVar39];
              pfVar50[lVar32 + -0x1a] = (fVar65 - fVar6) + auVar54._0_4_;
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(fVar66 - fVar72)),auVar56,
                                        ZEXT416((uint)(fVar71 - fVar5)));
              pfVar40[lVar32 + -0x1a] = auVar54._0_4_ - (fVar65 - fVar6);
              fVar66 = pfVar42[iVar26 + -1 + iVar20];
              fVar65 = pfVar42[iVar19 + -1 + iVar20];
              auVar85 = ZEXT464((uint)pfVar42[iVar39 + iVar19]);
              iVar29 = (int)auVar52._0_4_;
              fVar71 = pfVar42[iVar45 + iVar39];
              auVar54 = ZEXT416((uint)(pfVar42[iVar39 + iVar19] - pfVar42[iVar45 + -1 + iVar20]));
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar45 + iVar47] -
                                                      pfVar42[iVar47 + iVar19])),auVar56,auVar54);
              fVar5 = pfVar42[iVar26 + iVar39];
              pfVar50[lVar32 + -2] = (fVar65 - fVar71) + auVar52._0_4_;
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar66 - fVar5)),auVar56,auVar54);
              pfVar40[lVar32 + -2] = auVar52._0_4_ - (fVar65 - fVar71);
              iVar47 = iVar34 + -1 + iVar18;
              iVar20 = iVar34 + -1 + iVar49;
              fVar66 = pfVar42[iVar25 + -1 + iVar34];
              fVar65 = pfVar42[iVar27 + -1 + iVar34];
              fVar71 = pfVar42[iVar27 + iVar20];
              fVar5 = pfVar42[iVar24 + -1 + iVar34];
              fVar6 = pfVar42[iVar24 + iVar20];
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar24 + iVar47] -
                                                      pfVar42[iVar27 + iVar47])),auVar56,
                                        ZEXT416((uint)(fVar71 - fVar5)));
              fVar72 = pfVar42[iVar25 + iVar20];
              pfVar50[lVar32 + -0x19] = (fVar65 - fVar6) + auVar52._0_4_;
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar66 - fVar72)),auVar56,
                                        ZEXT416((uint)(fVar71 - fVar5)));
              pfVar40[lVar32 + -0x19] = auVar52._0_4_ - (fVar65 - fVar6);
              fVar66 = pfVar42[iVar26 + -1 + iVar34];
              fVar65 = pfVar42[iVar19 + -1 + iVar34];
              fVar71 = pfVar42[iVar20 + iVar19];
              fVar5 = pfVar42[iVar45 + -1 + iVar34];
              fVar6 = pfVar42[iVar45 + iVar20];
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar45 + iVar47] -
                                                      pfVar42[iVar47 + iVar19])),auVar56,
                                        ZEXT416((uint)(fVar71 - fVar5)));
              fVar72 = pfVar42[iVar26 + iVar20];
              pfVar50[lVar32 + -1] = (fVar65 - fVar6) + auVar52._0_4_;
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar66 - fVar72)),auVar56,
                                        ZEXT416((uint)(fVar71 - fVar5)));
              pfVar40[lVar32 + -1] = auVar52._0_4_ - (fVar65 - fVar6);
              iVar47 = iVar29 + -1 + iVar18;
              iVar34 = iVar29 + -1 + iVar49;
              fVar66 = pfVar42[iVar25 + -1 + iVar29];
              fVar65 = pfVar42[iVar27 + -1 + iVar29];
              fVar71 = pfVar42[iVar27 + iVar34];
              fVar5 = pfVar42[iVar24 + -1 + iVar29];
              fVar6 = pfVar42[iVar24 + iVar34];
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar24 + iVar47] -
                                                      pfVar42[iVar27 + iVar47])),auVar56,
                                        ZEXT416((uint)(fVar71 - fVar5)));
              fVar72 = pfVar42[iVar25 + iVar34];
              pfVar50[lVar32 + -0x18] = (fVar65 - fVar6) + auVar52._0_4_;
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar66 - fVar72)),auVar56,
                                        ZEXT416((uint)(fVar71 - fVar5)));
              pfVar40[lVar32 + -0x18] = auVar52._0_4_ - (fVar65 - fVar6);
              fVar66 = pfVar42[iVar26 + -1 + iVar29];
              fVar65 = pfVar42[iVar19 + -1 + iVar29];
              fVar71 = pfVar42[iVar34 + iVar19];
              fVar5 = pfVar42[iVar45 + -1 + iVar29];
              fVar6 = pfVar42[iVar45 + iVar34];
              fVar72 = pfVar42[iVar26 + iVar34];
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar42[iVar45 + iVar47] -
                                                      pfVar42[iVar47 + iVar19])),auVar56,
                                        ZEXT416((uint)(fVar71 - fVar5)));
              pfVar50[lVar32] = (fVar65 - fVar6) + auVar52._0_4_;
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar66 - fVar72)),auVar56,
                                        ZEXT416((uint)(fVar71 - fVar5)));
              pfVar40[lVar32] = auVar52._0_4_ - (fVar65 - fVar6);
              lVar32 = lVar32 + 6;
            } while (iVar28 + -0xc < 6);
            pfVar40 = pfVar40 + 0x30;
            pfVar50 = pfVar50 + 0x30;
            bVar2 = (int)uVar21 < 10;
            uVar21 = uVar21 + 2;
          } while (bVar2);
          goto LAB_001c231a;
        }
      }
    }
  }
  iVar1 = iVar18 * 2;
  lVar32 = 0;
  uVar21 = 0xfffffff4;
  do {
    auVar67._0_4_ = (float)(int)uVar21;
    auVar67._4_12_ = in_ZMM8._4_12_;
    auVar69._0_4_ = (float)(int)(uVar21 | 1);
    auVar69._4_12_ = in_ZMM8._4_12_;
    auVar52 = vfmadd213ss_fma(auVar67,auVar89._0_16_,ZEXT416((uint)fVar4));
    auVar54 = vfmadd213ss_fma(auVar69,auVar89._0_16_,ZEXT416((uint)fVar4));
    fVar65 = auVar52._0_4_;
    iVar45 = (int)((double)((ulong)(0.0 <= fVar65) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar65) * -0x4020000000000000) + (double)fVar65);
    fVar65 = auVar54._0_4_;
    iVar47 = (int)((double)((ulong)(0.0 <= fVar65) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar65) * -0x4020000000000000) + (double)fVar65);
    iVar24 = iVar1 + iVar45;
    iVar25 = iVar45 + -1;
    iVar26 = iVar45 + -1 + iVar18;
    iVar27 = iVar1 + iVar47;
    iVar28 = iVar47 + -1;
    iVar19 = iVar47 + -1 + iVar18;
    lVar31 = lVar32;
    iVar49 = -0xc;
    do {
      auVar68._0_4_ = (float)iVar49;
      auVar68._4_12_ = in_ZMM8._4_12_;
      auVar52 = vfmadd213ss_fma(auVar68,auVar89._0_16_,ZEXT416((uint)fVar3));
      auVar73._0_4_ = (float)(iVar49 + 1);
      auVar73._4_12_ = in_ZMM8._4_12_;
      auVar54 = vfmadd213ss_fma(auVar73,auVar89._0_16_,ZEXT416((uint)fVar3));
      fVar65 = auVar52._0_4_;
      fVar71 = auVar54._0_4_;
      pfVar42 = (float *)((long)haarResponseY + lVar31);
      iVar34 = (int)((double)((ulong)(0.0 <= fVar65) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar65) * -0x4020000000000000) + (double)fVar65);
      if ((((iVar45 < 1) || (iVar34 < 1)) || (iimage->height < iVar24)) ||
         (iVar20 = iVar1 + iVar34, iimage->width < iVar20)) {
        haarXY(iimage,iVar45,iVar34,iVar18,(float *)((long)haarResponseX + lVar31),pfVar42);
      }
      else {
        iVar36 = iVar34 + -1 + iVar18;
        pfVar50 = iimage->data;
        iVar39 = iimage->data_width;
        iVar29 = iVar39 * iVar25;
        fVar65 = pfVar50[iVar39 * iVar26 + -1 + iVar34];
        iVar37 = iVar39 * (iVar1 + -1 + iVar45);
        fVar5 = pfVar50[iVar37 + -1 + iVar34];
        fVar6 = pfVar50[iVar37 + -1 + iVar20];
        fVar72 = pfVar50[iVar29 + -1 + iVar34];
        fVar7 = pfVar50[iVar29 + -1 + iVar20];
        fVar8 = pfVar50[iVar39 * iVar26 + -1 + iVar20];
        auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar50[iVar29 + iVar36] - pfVar50[iVar37 + iVar36]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar6 - fVar72)));
        *(float *)((long)haarResponseX + lVar31) = (fVar5 - fVar7) + auVar52._0_4_;
        auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar8)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar6 - fVar72)));
        *pfVar42 = auVar52._0_4_ - (fVar5 - fVar7);
      }
      pfVar42 = (float *)((long)haarResponseX + lVar31 + 0x60);
      pfVar50 = (float *)((long)haarResponseY + lVar31 + 0x60);
      if (((iVar47 < 1) || (iVar34 < 1)) ||
         ((iimage->height < iVar27 || (iVar20 = iVar1 + iVar34, iimage->width < iVar20)))) {
        haarXY(iimage,iVar47,iVar34,iVar18,pfVar42,pfVar50);
      }
      else {
        iVar29 = iVar34 + -1 + iVar18;
        pfVar40 = iimage->data;
        iVar39 = iimage->data_width;
        iVar37 = iVar39 * iVar28;
        fVar65 = pfVar40[iVar39 * iVar19 + -1 + iVar34];
        iVar36 = iVar39 * (iVar1 + -1 + iVar47);
        fVar5 = pfVar40[iVar36 + -1 + iVar34];
        fVar6 = pfVar40[iVar36 + -1 + iVar20];
        fVar72 = pfVar40[iVar37 + -1 + iVar34];
        fVar7 = pfVar40[iVar37 + -1 + iVar20];
        fVar8 = pfVar40[iVar39 * iVar19 + -1 + iVar20];
        auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar37 + iVar29] - pfVar40[iVar36 + iVar29]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar6 - fVar72)));
        *pfVar42 = (fVar5 - fVar7) + auVar52._0_4_;
        auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar8)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar6 - fVar72)));
        *pfVar50 = auVar52._0_4_ - (fVar5 - fVar7);
      }
      iVar34 = (int)((double)((ulong)(0.0 <= fVar71) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar71) * -0x4020000000000000) + (double)fVar71);
      pfVar42 = (float *)((long)haarResponseX + lVar31 + 4);
      pfVar50 = (float *)((long)haarResponseY + lVar31 + 4);
      if (((iVar45 < 1) || (iVar34 < 1)) ||
         ((iimage->height < iVar24 || (iVar20 = iVar1 + iVar34, iimage->width < iVar20)))) {
        haarXY(iimage,iVar45,iVar34,iVar18,pfVar42,pfVar50);
      }
      else {
        iVar36 = iVar34 + -1 + iVar18;
        pfVar40 = iimage->data;
        iVar39 = iimage->data_width;
        iVar29 = iVar39 * iVar25;
        fVar65 = pfVar40[iVar39 * iVar26 + -1 + iVar34];
        iVar37 = iVar39 * (iVar1 + -1 + iVar45);
        fVar71 = pfVar40[iVar37 + -1 + iVar34];
        fVar5 = pfVar40[iVar37 + -1 + iVar20];
        fVar6 = pfVar40[iVar29 + -1 + iVar34];
        fVar72 = pfVar40[iVar29 + -1 + iVar20];
        fVar7 = pfVar40[iVar39 * iVar26 + -1 + iVar20];
        auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar29 + iVar36] - pfVar40[iVar37 + iVar36]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar42 = (fVar71 - fVar72) + auVar52._0_4_;
        auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar50 = auVar52._0_4_ - (fVar71 - fVar72);
      }
      pfVar42 = (float *)((long)haarResponseX + lVar31 + 100);
      pfVar50 = (float *)((long)haarResponseY + lVar31 + 100);
      if ((((iVar47 < 1) || (iVar34 < 1)) || (iimage->height < iVar27)) ||
         (iVar20 = iVar1 + iVar34, iimage->width < iVar20)) {
        haarXY(iimage,iVar47,iVar34,iVar18,pfVar42,pfVar50);
      }
      else {
        iVar29 = iVar34 + -1 + iVar18;
        pfVar40 = iimage->data;
        iVar39 = iimage->data_width;
        iVar37 = iVar39 * iVar28;
        fVar65 = pfVar40[iVar39 * iVar19 + -1 + iVar34];
        iVar36 = iVar39 * (iVar1 + -1 + iVar47);
        fVar71 = pfVar40[iVar36 + -1 + iVar34];
        fVar5 = pfVar40[iVar36 + -1 + iVar20];
        fVar6 = pfVar40[iVar37 + -1 + iVar34];
        fVar72 = pfVar40[iVar37 + -1 + iVar20];
        fVar7 = pfVar40[iVar39 * iVar19 + -1 + iVar20];
        auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar37 + iVar29] - pfVar40[iVar36 + iVar29]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar42 = (fVar71 - fVar72) + auVar52._0_4_;
        auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar50 = auVar52._0_4_ - (fVar71 - fVar72);
      }
      auVar52 = vpbroadcastd_avx512vl();
      auVar52 = vpaddd_avx(auVar52,_DAT_005766e0);
      auVar52 = vcvtdq2ps_avx(auVar52);
      auVar16._4_4_ = fVar3;
      auVar16._0_4_ = fVar3;
      auVar16._8_4_ = fVar3;
      auVar16._12_4_ = fVar3;
      auVar17._4_4_ = fVar66;
      auVar17._0_4_ = fVar66;
      auVar17._8_4_ = fVar66;
      auVar17._12_4_ = fVar66;
      auVar54 = vfmadd132ps_fma(auVar52,auVar16,auVar17);
      auVar52 = vshufps_avx(auVar54,auVar54,0xff);
      uVar22 = vcmpps_avx512vl(auVar54,_DAT_00576190,0xd);
      bVar51 = (byte)(uVar22 >> 3);
      iVar34 = (int)((double)((ulong)(bVar51 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar51 & 1) * -0x4020000000000000) +
                    (double)auVar52._0_4_);
      pfVar42 = (float *)((long)haarResponseX + lVar31 + 8);
      pfVar50 = (float *)((long)haarResponseY + lVar31 + 8);
      if (((iVar45 < 1) || (iVar34 < 1)) ||
         ((iimage->height < iVar24 || (iVar20 = iVar1 + iVar34, iimage->width < iVar20)))) {
        haarXY(iimage,iVar45,iVar34,iVar18,pfVar42,pfVar50);
      }
      else {
        iVar36 = iVar34 + -1 + iVar18;
        pfVar40 = iimage->data;
        iVar39 = iimage->data_width;
        iVar29 = iVar39 * iVar25;
        fVar65 = pfVar40[iVar39 * iVar26 + -1 + iVar34];
        iVar37 = iVar39 * (iVar1 + -1 + iVar45);
        fVar71 = pfVar40[iVar37 + -1 + iVar34];
        fVar5 = pfVar40[iVar37 + -1 + iVar20];
        fVar6 = pfVar40[iVar29 + -1 + iVar34];
        fVar72 = pfVar40[iVar29 + -1 + iVar20];
        fVar7 = pfVar40[iVar39 * iVar26 + -1 + iVar20];
        auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar29 + iVar36] - pfVar40[iVar37 + iVar36]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar42 = (fVar71 - fVar72) + auVar52._0_4_;
        auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar50 = auVar52._0_4_ - (fVar71 - fVar72);
      }
      pfVar42 = (float *)((long)haarResponseX + lVar31 + 0x68);
      pfVar50 = (float *)((long)haarResponseY + lVar31 + 0x68);
      if (((iVar47 < 1) || (iVar34 < 1)) ||
         ((iimage->height < iVar27 || (iVar20 = iVar1 + iVar34, iimage->width < iVar20)))) {
        haarXY(iimage,iVar47,iVar34,iVar18,pfVar42,pfVar50);
      }
      else {
        iVar29 = iVar34 + -1 + iVar18;
        pfVar40 = iimage->data;
        iVar39 = iimage->data_width;
        iVar37 = iVar39 * iVar28;
        fVar65 = pfVar40[iVar39 * iVar19 + -1 + iVar34];
        iVar36 = iVar39 * (iVar1 + -1 + iVar47);
        fVar71 = pfVar40[iVar36 + -1 + iVar34];
        fVar5 = pfVar40[iVar36 + -1 + iVar20];
        fVar6 = pfVar40[iVar37 + -1 + iVar34];
        fVar72 = pfVar40[iVar37 + -1 + iVar20];
        fVar7 = pfVar40[iVar39 * iVar19 + -1 + iVar20];
        auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar37 + iVar29] - pfVar40[iVar36 + iVar29]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar42 = (fVar71 - fVar72) + auVar52._0_4_;
        auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar50 = auVar52._0_4_ - (fVar71 - fVar72);
      }
      bVar51 = (byte)uVar22;
      auVar52 = vpermilpd_avx(auVar54,1);
      iVar34 = (int)((double)((ulong)(bVar51 >> 2 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar51 >> 2 & 1) * -0x4020000000000000) +
                    (double)auVar52._0_4_);
      pfVar42 = (float *)((long)haarResponseX + lVar31 + 0xc);
      pfVar50 = (float *)((long)haarResponseY + lVar31 + 0xc);
      if ((((iVar45 < 1) || (iVar34 < 1)) || (iimage->height < iVar24)) ||
         (iVar20 = iVar1 + iVar34, iimage->width < iVar20)) {
        haarXY(iimage,iVar45,iVar34,iVar18,pfVar42,pfVar50);
      }
      else {
        iVar36 = iVar34 + -1 + iVar18;
        pfVar40 = iimage->data;
        iVar39 = iimage->data_width;
        iVar29 = iVar39 * iVar25;
        fVar65 = pfVar40[iVar39 * iVar26 + -1 + iVar34];
        iVar37 = iVar39 * (iVar1 + -1 + iVar45);
        fVar71 = pfVar40[iVar37 + -1 + iVar34];
        fVar5 = pfVar40[iVar37 + -1 + iVar20];
        fVar6 = pfVar40[iVar29 + -1 + iVar34];
        fVar72 = pfVar40[iVar29 + -1 + iVar20];
        fVar7 = pfVar40[iVar39 * iVar26 + -1 + iVar20];
        auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar29 + iVar36] - pfVar40[iVar37 + iVar36]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar42 = (fVar71 - fVar72) + auVar52._0_4_;
        auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar50 = auVar52._0_4_ - (fVar71 - fVar72);
      }
      pfVar42 = (float *)((long)haarResponseX + lVar31 + 0x6c);
      pfVar50 = (float *)((long)haarResponseY + lVar31 + 0x6c);
      if (((iVar47 < 1) || (iVar34 < 1)) ||
         ((iimage->height < iVar27 || (iVar20 = iVar1 + iVar34, iimage->width < iVar20)))) {
        haarXY(iimage,iVar47,iVar34,iVar18,pfVar42,pfVar50);
      }
      else {
        iVar29 = iVar34 + -1 + iVar18;
        pfVar40 = iimage->data;
        iVar39 = iimage->data_width;
        iVar37 = iVar39 * iVar28;
        fVar65 = pfVar40[iVar39 * iVar19 + -1 + iVar34];
        iVar36 = iVar39 * (iVar1 + -1 + iVar47);
        fVar71 = pfVar40[iVar36 + -1 + iVar34];
        fVar5 = pfVar40[iVar36 + -1 + iVar20];
        fVar6 = pfVar40[iVar37 + -1 + iVar34];
        fVar72 = pfVar40[iVar37 + -1 + iVar20];
        fVar7 = pfVar40[iVar39 * iVar19 + -1 + iVar20];
        auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar37 + iVar29] - pfVar40[iVar36 + iVar29]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar42 = (fVar71 - fVar72) + auVar52._0_4_;
        auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar50 = auVar52._0_4_ - (fVar71 - fVar72);
      }
      auVar52 = vmovshdup_avx(auVar54);
      iVar34 = (int)((double)((ulong)(bVar51 >> 1 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar51 >> 1 & 1) * -0x4020000000000000) +
                    (double)auVar52._0_4_);
      pfVar42 = (float *)((long)haarResponseX + lVar31 + 0x10);
      pfVar50 = (float *)((long)haarResponseY + lVar31 + 0x10);
      if (((iVar45 < 1) || (iVar34 < 1)) ||
         ((iimage->height < iVar24 || (iVar20 = iVar1 + iVar34, iimage->width < iVar20)))) {
        haarXY(iimage,iVar45,iVar34,iVar18,pfVar42,pfVar50);
      }
      else {
        iVar36 = iVar34 + -1 + iVar18;
        pfVar40 = iimage->data;
        iVar39 = iimage->data_width;
        iVar29 = iVar39 * iVar25;
        fVar65 = pfVar40[iVar39 * iVar26 + -1 + iVar34];
        iVar37 = iVar39 * (iVar1 + -1 + iVar45);
        fVar71 = pfVar40[iVar37 + -1 + iVar34];
        fVar5 = pfVar40[iVar37 + -1 + iVar20];
        fVar6 = pfVar40[iVar29 + -1 + iVar34];
        fVar72 = pfVar40[iVar29 + -1 + iVar20];
        fVar7 = pfVar40[iVar39 * iVar26 + -1 + iVar20];
        auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar29 + iVar36] - pfVar40[iVar37 + iVar36]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar42 = (fVar71 - fVar72) + auVar52._0_4_;
        auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar50 = auVar52._0_4_ - (fVar71 - fVar72);
      }
      pfVar42 = (float *)((long)haarResponseX + lVar31 + 0x70);
      pfVar50 = (float *)((long)haarResponseY + lVar31 + 0x70);
      if ((((iVar47 < 1) || (iVar34 < 1)) || (iimage->height < iVar27)) ||
         (iVar20 = iVar1 + iVar34, iimage->width < iVar20)) {
        haarXY(iimage,iVar47,iVar34,iVar18,pfVar42,pfVar50);
      }
      else {
        iVar29 = iVar34 + -1 + iVar18;
        pfVar40 = iimage->data;
        iVar39 = iimage->data_width;
        iVar37 = iVar39 * iVar28;
        fVar65 = pfVar40[iVar39 * iVar19 + -1 + iVar34];
        iVar36 = iVar39 * (iVar1 + -1 + iVar47);
        fVar71 = pfVar40[iVar36 + -1 + iVar34];
        fVar5 = pfVar40[iVar36 + -1 + iVar20];
        fVar6 = pfVar40[iVar37 + -1 + iVar34];
        fVar72 = pfVar40[iVar37 + -1 + iVar20];
        fVar7 = pfVar40[iVar39 * iVar19 + -1 + iVar20];
        auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar37 + iVar29] - pfVar40[iVar36 + iVar29]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar42 = (fVar71 - fVar72) + auVar52._0_4_;
        auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar50 = auVar52._0_4_ - (fVar71 - fVar72);
      }
      local_f8 = auVar54._0_4_;
      iVar34 = (int)((double)((ulong)(bVar51 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar51 & 1) * -0x4020000000000000) + (double)local_f8);
      pfVar42 = (float *)((long)haarResponseX + lVar31 + 0x14);
      pfVar50 = (float *)((long)haarResponseY + lVar31 + 0x14);
      if (((iVar45 < 1) || (iVar34 < 1)) ||
         ((iimage->height < iVar24 || (iVar20 = iVar1 + iVar34, iimage->width < iVar20)))) {
        haarXY(iimage,iVar45,iVar34,iVar18,pfVar42,pfVar50);
      }
      else {
        iVar36 = iVar34 + -1 + iVar18;
        pfVar40 = iimage->data;
        iVar39 = iimage->data_width;
        iVar29 = iVar39 * iVar25;
        fVar65 = pfVar40[iVar39 * iVar26 + -1 + iVar34];
        iVar37 = iVar39 * (iVar1 + -1 + iVar45);
        fVar71 = pfVar40[iVar37 + -1 + iVar34];
        fVar5 = pfVar40[iVar37 + -1 + iVar20];
        fVar6 = pfVar40[iVar29 + -1 + iVar34];
        fVar72 = pfVar40[iVar29 + -1 + iVar20];
        fVar7 = pfVar40[iVar39 * iVar26 + -1 + iVar20];
        auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar29 + iVar36] - pfVar40[iVar37 + iVar36]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar42 = (fVar71 - fVar72) + auVar52._0_4_;
        auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar50 = auVar52._0_4_ - (fVar71 - fVar72);
      }
      pfVar42 = (float *)((long)haarResponseX + lVar31 + 0x74);
      pfVar50 = (float *)((long)haarResponseY + lVar31 + 0x74);
      if (((iVar47 < 1) || (iVar34 < 1)) ||
         ((iimage->height < iVar27 || (iVar20 = iVar1 + iVar34, iimage->width < iVar20)))) {
        haarXY(iimage,iVar47,iVar34,iVar18,pfVar42,pfVar50);
      }
      else {
        iVar29 = iVar34 + -1 + iVar18;
        pfVar40 = iimage->data;
        iVar39 = iimage->data_width;
        iVar37 = iVar39 * iVar28;
        fVar65 = pfVar40[iVar39 * iVar19 + -1 + iVar34];
        iVar36 = iVar39 * (iVar1 + -1 + iVar47);
        fVar71 = pfVar40[iVar36 + -1 + iVar34];
        fVar5 = pfVar40[iVar36 + -1 + iVar20];
        fVar6 = pfVar40[iVar37 + -1 + iVar34];
        fVar72 = pfVar40[iVar37 + -1 + iVar20];
        fVar7 = pfVar40[iVar39 * iVar19 + -1 + iVar20];
        auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar40[iVar37 + iVar29] - pfVar40[iVar36 + iVar29]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar42 = (fVar71 - fVar72) + auVar52._0_4_;
        auVar52 = vfmadd213ss_fma(ZEXT416((uint)(fVar65 - fVar7)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar5 - fVar6)));
        *pfVar50 = auVar52._0_4_ - (fVar71 - fVar72);
      }
      auVar89 = ZEXT1664(auVar53);
      lVar31 = lVar31 + 0x18;
      bVar2 = iVar49 < 6;
      iVar49 = iVar49 + 6;
    } while (bVar2);
    lVar32 = lVar32 + 0xc0;
    bVar2 = (int)uVar21 < 10;
    uVar21 = uVar21 + 2;
  } while (bVar2);
LAB_001c231a:
  fVar66 = auVar89._0_4_;
  auVar88._8_4_ = 0x3effffff;
  auVar88._0_8_ = 0x3effffff3effffff;
  auVar88._12_4_ = 0x3effffff;
  auVar87._8_4_ = 0x80000000;
  auVar87._0_8_ = 0x8000000080000000;
  auVar87._12_4_ = 0x80000000;
  auVar52 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar66 * 0.5)),auVar87,0xf8);
  auVar52 = ZEXT416((uint)(fVar66 * 0.5 + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar66 * 1.5)),auVar87,0xf8);
  auVar53 = ZEXT416((uint)(fVar66 * 1.5 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar66 * 2.5)),auVar87,0xf8);
  auVar54 = ZEXT416((uint)(fVar66 * 2.5 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar66 * 3.5)),auVar87,0xf8);
  auVar55 = ZEXT416((uint)(fVar66 * 3.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar66 * 4.5)),auVar87,0xf8);
  auVar56 = ZEXT416((uint)(fVar66 * 4.5 + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar57 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar66 * 5.5)),auVar87,0xf8);
  auVar57 = ZEXT416((uint)(fVar66 * 5.5 + auVar57._0_4_));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  auVar58 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar66 * 6.5)),auVar87,0xf8);
  auVar58 = ZEXT416((uint)(fVar66 * 6.5 + auVar58._0_4_));
  auVar58 = vroundss_avx(auVar58,auVar58,0xb);
  auVar59 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar66 * 7.5)),auVar87,0xf8);
  auVar59 = ZEXT416((uint)(auVar59._0_4_ + fVar66 * 7.5));
  auVar59 = vroundss_avx(auVar59,auVar59,0xb);
  auVar60 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar66 * 8.5)),auVar87,0xf8);
  auVar60 = ZEXT416((uint)(fVar66 * 8.5 + auVar60._0_4_));
  auVar60 = vroundss_avx(auVar60,auVar60,0xb);
  auVar61 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar66 * 9.5)),auVar87,0xf8);
  auVar61 = ZEXT416((uint)(fVar66 * 9.5 + auVar61._0_4_));
  auVar61 = vroundss_avx(auVar61,auVar61,0xb);
  auVar62 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar66 * 10.5)),auVar87,0xf8);
  auVar62 = ZEXT416((uint)(fVar66 * 10.5 + auVar62._0_4_));
  auVar62 = vroundss_avx(auVar62,auVar62,0xb);
  auVar63 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar66 * 11.5)),auVar87,0xf8);
  auVar63 = ZEXT416((uint)(fVar66 * 11.5 + auVar63._0_4_));
  auVar63 = vroundss_avx(auVar63,auVar63,0xb);
  fVar72 = auVar54._0_4_;
  fVar66 = fVar72 + auVar53._0_4_;
  fVar3 = fVar72 + auVar52._0_4_;
  fVar4 = fVar72 - auVar52._0_4_;
  fVar65 = fVar72 - auVar53._0_4_;
  fVar71 = fVar72 - auVar55._0_4_;
  fVar5 = fVar72 - auVar56._0_4_;
  fVar6 = fVar72 - auVar57._0_4_;
  fVar72 = fVar72 - auVar58._0_4_;
  fVar84 = auVar59._0_4_;
  fVar7 = fVar84 - auVar55._0_4_;
  fVar8 = fVar84 - auVar56._0_4_;
  fVar9 = fVar84 - auVar57._0_4_;
  fVar10 = fVar84 - auVar58._0_4_;
  fVar11 = fVar84 - auVar60._0_4_;
  fVar12 = fVar84 - auVar61._0_4_;
  fVar13 = fVar84 - auVar62._0_4_;
  fVar84 = fVar84 - auVar63._0_4_;
  gauss_s1_c0[0] = expf(fVar66 * fVar66 * fVar64);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar64);
  gauss_s1_c0[2] = expf(fVar4 * fVar4 * fVar64);
  gauss_s1_c0[3] = expf(fVar65 * fVar65 * fVar64);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar71 * fVar71 * fVar64);
  gauss_s1_c0[6] = expf(fVar5 * fVar5 * fVar64);
  gauss_s1_c0[7] = expf(fVar6 * fVar6 * fVar64);
  gauss_s1_c0[8] = expf(fVar72 * fVar72 * fVar64);
  gauss_s1_c1[0] = expf(fVar7 * fVar7 * fVar64);
  gauss_s1_c1[1] = expf(fVar8 * fVar8 * fVar64);
  gauss_s1_c1[2] = expf(fVar9 * fVar9 * fVar64);
  gauss_s1_c1[3] = expf(fVar10 * fVar10 * fVar64);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar11 * fVar11 * fVar64);
  gauss_s1_c1[6] = expf(fVar12 * fVar12 * fVar64);
  gauss_s1_c1[7] = expf(fVar13 * fVar13 * fVar64);
  gauss_s1_c1[8] = expf(fVar84 * fVar84 * fVar64);
  uVar22 = 0xfffffff8;
  lVar32 = 0;
  fVar66 = 0.0;
  auVar70._8_4_ = 0x7fffffff;
  auVar70._0_8_ = 0x7fffffff7fffffff;
  auVar70._12_4_ = 0x7fffffff;
  lVar31 = 0;
  lVar43 = 0;
  do {
    pfVar42 = gauss_s1_c1;
    uVar21 = (uint)uVar22;
    if (uVar21 != 7) {
      pfVar42 = gauss_s1_c0;
    }
    if (uVar21 == 0xfffffff8) {
      pfVar42 = gauss_s1_c1;
    }
    lVar31 = (long)(int)lVar31;
    iVar18 = (int)lVar43;
    lVar43 = (long)iVar18;
    lVar41 = (long)haarResponseX + lVar32;
    lVar33 = (long)haarResponseY + lVar32;
    uVar38 = 0xfffffff8;
    uVar35 = 0;
    do {
      pfVar50 = gauss_s1_c1;
      if (uVar38 != 7) {
        pfVar50 = gauss_s1_c0;
      }
      if (uVar38 == 0xfffffff8) {
        pfVar50 = gauss_s1_c1;
      }
      uVar23 = (ulong)(uVar38 >> 0x1c & 0xfffffff8);
      auVar85 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar30 = uVar35;
      lVar46 = lVar41;
      lVar48 = lVar33;
      do {
        lVar44 = 0;
        pfVar40 = (float *)((long)pfVar42 + (ulong)(uint)((int)(uVar22 >> 0x1f) << 5));
        do {
          fVar3 = pfVar50[uVar23] * *pfVar40;
          auVar52 = vinsertps_avx(ZEXT416(*(uint *)(lVar48 + lVar44 * 4)),
                                  ZEXT416(*(uint *)(lVar46 + lVar44 * 4)),0x10);
          auVar81._0_4_ = fVar3 * auVar52._0_4_;
          auVar81._4_4_ = fVar3 * auVar52._4_4_;
          auVar81._8_4_ = fVar3 * auVar52._8_4_;
          auVar81._12_4_ = fVar3 * auVar52._12_4_;
          auVar52 = vandps_avx(auVar81,auVar70);
          auVar52 = vmovlhps_avx(auVar81,auVar52);
          auVar74._0_4_ = auVar85._0_4_ + auVar52._0_4_;
          auVar74._4_4_ = auVar85._4_4_ + auVar52._4_4_;
          auVar74._8_4_ = auVar85._8_4_ + auVar52._8_4_;
          auVar74._12_4_ = auVar85._12_4_ + auVar52._12_4_;
          auVar85 = ZEXT1664(auVar74);
          pfVar40 = pfVar40 + (ulong)(~uVar21 >> 0x1f) * 2 + -1;
          lVar44 = lVar44 + 1;
        } while (lVar44 != 9);
        uVar30 = uVar30 + 0x18;
        uVar23 = uVar23 + (ulong)(-1 < (int)uVar38) * 2 + -1;
        lVar46 = lVar46 + 0x60;
        lVar48 = lVar48 + 0x60;
      } while (uVar30 < uVar38 * 0x18 + 0x198);
      fVar3 = gauss_s2_arr[lVar43];
      auVar15._4_4_ = fVar3;
      auVar15._0_4_ = fVar3;
      auVar15._8_4_ = fVar3;
      auVar15._12_4_ = fVar3;
      auVar54 = vmulps_avx512vl(auVar74,auVar15);
      lVar43 = lVar43 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar31) = auVar54;
      auVar75._0_4_ = auVar54._0_4_ * auVar54._0_4_;
      auVar75._4_4_ = auVar54._4_4_ * auVar54._4_4_;
      auVar75._8_4_ = auVar54._8_4_ * auVar54._8_4_;
      auVar75._12_4_ = auVar54._12_4_ * auVar54._12_4_;
      auVar52 = vmovshdup_avx(auVar75);
      auVar53 = vfmadd231ss_fma(auVar52,auVar54,auVar54);
      auVar52 = vshufpd_avx(auVar54,auVar54,1);
      auVar53 = vfmadd213ss_fma(auVar52,auVar52,auVar53);
      auVar52 = vshufps_avx(auVar54,auVar54,0xff);
      auVar52 = vfmadd213ss_fma(auVar52,auVar52,auVar53);
      fVar66 = fVar66 + auVar52._0_4_;
      lVar31 = lVar31 + 4;
      uVar38 = uVar38 + 5;
      uVar35 = uVar35 + 0x78;
      lVar41 = lVar41 + 0x1e0;
      lVar33 = lVar33 + 0x1e0;
    } while (iVar18 + 4 != (int)lVar43);
    lVar32 = lVar32 + 0x14;
    uVar22 = (ulong)(uVar21 + 5);
  } while ((int)uVar21 < 3);
  if (fVar66 < 0.0) {
    fVar66 = sqrtf(fVar66);
  }
  else {
    auVar52 = vsqrtss_avx(ZEXT416((uint)fVar66),ZEXT416((uint)fVar66));
    fVar66 = auVar52._0_4_;
  }
  auVar85 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar66)));
  lVar32 = 0;
  do {
    auVar89 = vmulps_avx512f(auVar85,*(undefined1 (*) [64])(ipoint->descriptor + lVar32));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar32) = auVar89;
    lVar32 = lVar32 + 0x10;
  } while (lVar32 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_2_6_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=6, k_count+=6) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

            for (int k=-12, k_count=0; k<12; k+=6, k_count+=6) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}